

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O0

result_t * exttposeWrapper(result_t *__return_storage_ptr__,string *s,shared_ptr<Env> *envptr)

{
  bool bVar1;
  element_type *env_00;
  undefined1 local_768 [8];
  Env env;
  undefined1 local_178 [8];
  ExttposeArgument args;
  args_t args_;
  shared_ptr<Env> *envptr_local;
  string *s_local;
  
  parse((string *)&args.field_0x140);
  ExttposeArgument::ExttposeArgument((ExttposeArgument *)local_178);
  ExttposeArgument::parse_args((ExttposeArgument *)local_178,args._320_4_,(char **)args_._0_8_);
  bVar1 = std::operator==(envptr,(nullptr_t)0x0);
  if (bVar1) {
    Env::Env((Env *)local_768);
    exttposeFunc(__return_storage_ptr__,(Env *)local_768,(ExttposeArgument *)local_178);
    Env::~Env((Env *)local_768);
  }
  else {
    env_00 = std::__shared_ptr_access<Env,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                       ((__shared_ptr_access<Env,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)envptr
                       );
    exttposeFunc(__return_storage_ptr__,env_00,(ExttposeArgument *)local_178);
  }
  ExttposeArgument::~ExttposeArgument((ExttposeArgument *)local_178);
  args_t::~args_t((args_t *)&args.field_0x140);
  return __return_storage_ptr__;
}

Assistant:

result_t exttposeWrapper(const string &s, shared_ptr<Env>& envptr) {
    args_t args_ = parse(s);
    ExttposeArgument args;
    args.parse_args(args_.argc, args_.argv);
    if (envptr == nullptr) {
        Env env;
        return exttposeFunc(env, args);
    }
    else {
        return exttposeFunc(*envptr, args);
    }
}